

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

lys_module * ly_ctx_get_disabled_module_iter(ly_ctx *ctx,uint32_t *idx)

{
  lys_module **pplVar1;
  lys_module *plVar2;
  ulong uVar3;
  
  if (idx == (uint32_t *)0x0 || ctx == (ly_ctx *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).",
           "ly_ctx_get_disabled_module_iter");
  }
  else {
    uVar3 = (ulong)*idx;
    if (*idx < (uint)(ctx->models).used) {
      pplVar1 = (ctx->models).list;
      do {
        plVar2 = pplVar1[uVar3];
        if ((plVar2->field_0x40 & 0x40) != 0) {
          *idx = (int)uVar3 + 1;
          return plVar2;
        }
        uVar3 = uVar3 + 1;
        *idx = (uint32_t)uVar3;
      } while (uVar3 < (uint)(ctx->models).used);
    }
  }
  return (lys_module *)0x0;
}

Assistant:

lys_module *
ly_ctx_get_disabled_module_iter(const struct ly_ctx *ctx, uint32_t *idx)
{
    if (!ctx || !idx) {
        LOGARG;
        return NULL;
    }

    for ( ; *idx < (unsigned)ctx->models.used; (*idx)++) {
        if (ctx->models.list[(*idx)]->disabled) {
            return ctx->models.list[(*idx)++];
        }
    }

    return NULL;
}